

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# result.h
# Opt level: O1

void __thiscall wabt::Stream::Truncate(Stream *this,size_t size)

{
  Enum EVar1;
  
  if ((this->result_).enum_ != Error) {
    if (this->log_stream_ != (Stream *)0x0) {
      Writef(this->log_stream_,"; truncate to %zd (0x%zx)\n",size,size);
    }
    EVar1 = (*this->_vptr_Stream[5])(this,size);
    (this->result_).enum_ = EVar1;
    if ((EVar1 == Ok) && (size < this->offset_)) {
      this->offset_ = size;
    }
  }
  return;
}

Assistant:

inline bool Failed(Result result) {
  return result == Result::Error;
}